

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,FinalStmtBlock *stmt)

{
  char cVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ostream *poVar6;
  uint64_t uVar7;
  undefined4 extraout_var;
  string local_b0;
  string_view local_90;
  ulong local_80;
  uint64_t i;
  string local_48;
  string_view local_28;
  StmtBlock *local_18;
  FinalStmtBlock *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_18 = &stmt->super_StmtBlock;
  stmt_local = (FinalStmtBlock *)this;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_28 = indent(this);
    pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->stream_).super_stringstream.field_0x10,local_28);
    poVar6 = std::operator<<(pbVar5,"// ");
    strip_newline(&local_48,&(((StmtBlock *)&local_18->super_Stmt)->super_Stmt).super_IRNode.comment
                 );
    poVar6 = std::operator<<(poVar6,(string *)&local_48);
    cVar1 = Stream::endl(&this->stream_);
    std::operator<<(poVar6,cVar1);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((this->generator_->debug & 1U) != 0) {
    uVar2 = Stream::line_no(&this->stream_);
    (((StmtBlock *)&local_18->super_Stmt)->super_Stmt).super_IRNode.verilog_ln = uVar2;
  }
  poVar6 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"final begin");
  block_label_abi_cxx11_((string *)&i,this,local_18);
  poVar6 = std::operator<<(poVar6,(string *)&i);
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar6,cVar1);
  std::__cxx11::string::~string((string *)&i);
  this->indent_ = this->indent_ + 1;
  local_80 = 0;
  while( true ) {
    uVar4 = local_80;
    uVar7 = StmtBlock::size(local_18);
    if (uVar7 <= uVar4) break;
    iVar3 = (*(local_18->super_Stmt).super_IRNode._vptr_IRNode[2])(local_18,local_80);
    (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var,iVar3));
    local_80 = local_80 + 1;
  }
  this->indent_ = this->indent_ - 1;
  local_90 = indent(this);
  pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_90);
  poVar6 = std::operator<<(pbVar5,"end");
  block_label_abi_cxx11_(&local_b0,this,local_18);
  poVar6 = std::operator<<(poVar6,(string *)&local_b0);
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar6,cVar1);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::FinalStmtBlock* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }

    stream_ << "final begin" << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->size(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}